

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O0

void arkStep_ApplyForcing
               (ARKodeARKStepMem step_mem,sunrealtype *stage_times,sunrealtype *stage_coefs,int jmax
               ,int *nvec)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  sunrealtype *psVar6;
  N_Vector *pp_Var7;
  N_Vector *pp_Var8;
  int offset;
  N_Vector *forcing;
  int nforcing;
  sunrealtype tscale;
  sunrealtype tshift;
  N_Vector *vecs;
  sunrealtype *vals;
  int k;
  int j;
  sunrealtype taui;
  sunrealtype tau;
  int *nvec_local;
  int jmax_local;
  sunrealtype *stage_coefs_local;
  sunrealtype *stage_times_local;
  ARKodeARKStepMem step_mem_local;
  
  psVar6 = step_mem->cvals;
  pp_Var7 = step_mem->Xvecs;
  dVar1 = step_mem->tshift;
  dVar2 = step_mem->tscale;
  iVar4 = step_mem->nforcing;
  pp_Var8 = step_mem->forcing;
  iVar5 = *nvec;
  for (k = 0; k < iVar4; k = k + 1) {
    psVar6[iVar5 + k] = 0.0;
    pp_Var7[iVar5 + k] = pp_Var8[k];
  }
  for (j = 0; j < jmax; j = j + 1) {
    dVar3 = stage_times[j];
    taui = 1.0;
    for (k = 0; k < iVar4; k = k + 1) {
      psVar6[iVar5 + k] = stage_coefs[j] * taui + psVar6[iVar5 + k];
      taui = ((dVar3 - dVar1) / dVar2) * taui;
    }
  }
  *nvec = iVar4 + *nvec;
  return;
}

Assistant:

void arkStep_ApplyForcing(ARKodeARKStepMem step_mem, sunrealtype* stage_times,
                          sunrealtype* stage_coefs, int jmax, int* nvec)
{
  sunrealtype tau, taui;
  int j, k;

  /* Shortcuts to step_mem data */
  sunrealtype* vals  = step_mem->cvals;
  N_Vector* vecs     = step_mem->Xvecs;
  sunrealtype tshift = step_mem->tshift;
  sunrealtype tscale = step_mem->tscale;
  int nforcing       = step_mem->nforcing;
  N_Vector* forcing  = step_mem->forcing;

  /* Offset into vals and vecs arrays */
  int offset = *nvec;

  /* Initialize scaling values, set vectors */
  for (k = 0; k < nforcing; k++)
  {
    vals[offset + k] = ZERO;
    vecs[offset + k] = forcing[k];
  }

  for (j = 0; j < jmax; j++)
  {
    tau  = (stage_times[j] - tshift) / tscale;
    taui = ONE;

    for (k = 0; k < nforcing; k++)
    {
      vals[offset + k] += stage_coefs[j] * taui;
      taui *= tau;
    }
  }

  /* Update vector count for linear combination */
  *nvec += nforcing;
}